

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * iutest::detail::ToHexString<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long value)

{
  char cVar1;
  allocator<char> local_41;
  ulong local_40;
  size_t i;
  char buf [17];
  size_t kN;
  unsigned_long value_local;
  
  stack0xffffffffffffffe0 = 0x10;
  memset(&i,0,0x11);
  for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
    cVar1 = ToHex((uint)(value >> (('\x0f' - (char)local_40) * '\x04' & 0x3fU)));
    buf[local_40 - 8] = cVar1;
  }
  buf[8] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&i,&local_41);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(T value)
{
    const size_t kN = sizeof(T)*2;
    char buf[kN + 1] = {0};
    for( size_t i=0; i < kN; ++i )
    {
        buf[i] = ToHex(static_cast<unsigned int>((value>>((kN-i-1)*4))));
    }
    buf[kN] = '\0';
    return buf;
}